

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_duration * mg_duration_copy(mg_duration *duration)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  mg_duration *pmVar4;
  
  if ((duration != (mg_duration *)0x0) &&
     (pmVar4 = (mg_duration *)mg_allocator_malloc(&mg_system_allocator,0x20),
     pmVar4 != (mg_duration *)0x0)) {
    iVar1 = duration->months;
    iVar2 = duration->days;
    iVar3 = duration->nanoseconds;
    pmVar4->seconds = duration->seconds;
    pmVar4->nanoseconds = iVar3;
    pmVar4->months = iVar1;
    pmVar4->days = iVar2;
    return pmVar4;
  }
  return (mg_duration *)0x0;
}

Assistant:

mg_duration *mg_duration_copy_ca(const mg_duration *src,
                                 mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_duration *duration = mg_duration_alloc(allocator);
  if (!duration) {
    return NULL;
  }
  memcpy(duration, src, sizeof(mg_duration));
  return duration;
}